

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O2

void cfd::core::logger::log<long_const&>
               (CfdSourceLocation *source,CfdLogLevel lvl,char *fmt,long *args)

{
  char cVar1;
  basic_string_view<char> bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  long local_38 [3];
  
  cVar1 = cfd::core::logger::IsEnableLogLevel(lvl);
  if (cVar1 != '\0') {
    local_38[0] = *args;
    bVar2 = ::fmt::v7::to_string_view<char,_0>(fmt);
    ::fmt::v7::detail::vformat_abi_cxx11_(&message,bVar2.data_,bVar2.size_,3,local_38);
    cfd::core::logger::WriteLog(source,lvl,(string *)&message);
    std::__cxx11::string::~string((string *)&message);
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt, Args &&...args) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    auto message = fmt::format(fmt, args...);
    // std::string message = fmt::format(std::locale::messages, fmt, args...);
    cfd::core::logger::WriteLog(source, lvl, message);
  }
}